

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O1

Result<wasm::WATParser::TypeUse> * __thiscall
wasm::WATParser::ParseModuleTypesCtx::makeTypeUse
          (Result<wasm::WATParser::TypeUse> *__return_storage_ptr__,ParseModuleTypesCtx *this,
          Index pos,
          optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
          type,ParamsT *params,ResultsT *results)

{
  pointer pNVar1;
  ulong uVar2;
  char *pcVar3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  NameType *p;
  pointer __args;
  HeapType local_70;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_68;
  ParseModuleTypesCtx *local_50;
  undefined1 auStack_48 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> ids;
  
  auStack_48 = (undefined1  [8])0x0;
  ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_50 = this;
  if (params != (ParamsT *)0x0) {
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::reserve
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_48,
               ((long)(params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    __args = (params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pNVar1 = (params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (__args != pNVar1) {
      do {
        if (ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start ==
            ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_48,
                     (iterator)
                     ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_start,&__args->name);
        }
        else {
          pcVar3 = (__args->name).super_IString.str._M_str;
          ((ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_len =
               (__args->name).super_IString.str._M_len;
          ((ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar3;
          ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start =
               ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        __args = __args + 1;
      } while (__args != pNVar1);
    }
  }
  if (type.
      super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_true,_true>
      ._M_payload.
      super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
      ._M_engaged == true) {
    local_70.id = (uintptr_t)
                  type.
                  super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                  ._M_payload._M_value.type.id;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              (&local_68,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_48);
  }
  else {
    uVar2 = (local_50->implicitTypes->_M_h)._M_bucket_count;
    uVar5 = (ulong)pos % uVar2;
    p_Var6 = (local_50->implicitTypes->_M_h)._M_buckets[uVar5];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(Index *)&p_Var6->_M_nxt[1]._M_nxt != pos)) {
      while (p_Var6 = p_Var4, p_Var4 = p_Var6->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar2 != uVar5) ||
           (p_Var7 = p_Var6, *(uint *)&p_Var4[1]._M_nxt == pos)) goto LAB_00bdb61f;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_00bdb61f:
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var7->_M_nxt;
    }
    if (p_Var4 == (_Hash_node_base *)0x0) {
      __assert_fail("it != implicitTypes.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/contexts.h"
                    ,0x527,
                    "Result<TypeUseT> wasm::WATParser::ParseModuleTypesCtx::makeTypeUse(Index, std::optional<HeapTypeT>, ParamsT *, ResultsT *)"
                   );
    }
    local_70.id = (uintptr_t)p_Var4[2]._M_nxt;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              (&local_68,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_48);
  }
  *(uintptr_t *)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err> = local_70.id;
  *(pointer *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err> + 8) =
       local_68.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x10) =
       local_68.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x18) =
       local_68.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20) = '\0';
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<TypeUseT> makeTypeUse(Index pos,
                               std::optional<HeapTypeT> type,
                               ParamsT* params,
                               ResultsT* results) {
    std::vector<Name> ids;
    if (params) {
      ids.reserve(params->size());
      for (auto& p : *params) {
        ids.push_back(p.name);
      }
    }

    if (type) {
      return TypeUse{*type, ids};
    }

    auto it = implicitTypes.find(pos);
    assert(it != implicitTypes.end());

    return TypeUse{it->second, ids};
  }